

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void anon_unknown.dwarf_5f7fa::Dilate
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,uint32_t dilationX
               ,uint32_t dilationY,uint8_t value)

{
  byte *pbVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  void *pvVar8;
  byte *pbVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint8_t *imageXStart;
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint8_t *puVar18;
  uint uVar19;
  uchar *puVar20;
  undefined8 *puVar21;
  uchar *puVar22;
  uchar *local_98;
  byte *local_90;
  uchar *local_78;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  uVar4 = width >> 1;
  if (dilationX <= width >> 1) {
    uVar4 = dilationX;
  }
  uVar3 = height >> 1;
  if (dilationY <= height >> 1) {
    uVar3 = dilationY;
  }
  uVar12 = (ulong)x;
  uVar6 = (ulong)width;
  if (uVar4 != 0) {
    puVar7 = (undefined8 *)operator_new__((ulong)(width * 2) << 3);
    uVar19 = image->_rowSize;
    if (uVar19 * height != 0) {
      puVar20 = image->_data;
      uVar16 = (ulong)(uVar19 * y);
      pbVar14 = puVar20 + uVar16 + uVar12;
      pbVar1 = pbVar14 + uVar19 * height;
      uVar15 = (ulong)uVar4;
      puVar22 = puVar20 + uVar12 + uVar16 + 1;
      puVar20 = puVar20 + ((uVar12 + 1 + uVar16) - uVar15);
      do {
        uVar4 = 0;
        if (width != 1) {
          bVar10 = *pbVar14;
          lVar11 = 0;
          uVar4 = 0;
          uVar16 = uVar6;
          do {
            uVar16 = uVar16 - 1;
            uVar17 = uVar16;
            if ((long)uVar15 < (long)uVar16) {
              uVar17 = uVar15;
            }
            if (pbVar14[lVar11 + 1] != bVar10) {
              pbVar9 = puVar20 + lVar11;
              if (lVar11 + 1 < (long)uVar15) {
                pbVar9 = pbVar14;
              }
              puVar7[uVar4] = pbVar9;
              puVar7[uVar6 + uVar4] = puVar22 + lVar11 + uVar17;
              bVar10 = ~bVar10;
              uVar4 = uVar4 + 1;
            }
            lVar11 = lVar11 + 1;
          } while ((1 - uVar6) + lVar11 != 0);
        }
        if (uVar4 != 0) {
          uVar16 = (ulong)uVar4;
          puVar21 = puVar7;
          do {
            pvVar8 = (void *)*puVar21;
            if (pvVar8 != (void *)puVar21[uVar6]) {
              memset(pvVar8,(uint)value,(long)puVar21[uVar6] - (long)pvVar8);
            }
            puVar21 = puVar21 + 1;
            uVar16 = uVar16 - 1;
          } while (uVar16 != 0);
        }
        pbVar14 = pbVar14 + uVar19;
        puVar22 = puVar22 + uVar19;
        puVar20 = puVar20 + uVar19;
      } while (pbVar14 != pbVar1);
    }
    operator_delete__(puVar7);
  }
  if (uVar3 != 0) {
    pvVar8 = operator_new__((ulong)(height * 2) << 3);
    if (width != 0) {
      uVar4 = image->_rowSize;
      uVar16 = (ulong)uVar4;
      local_78 = image->_data;
      local_90 = local_78 + y * uVar4 + uVar12;
      pbVar1 = local_90 + uVar6;
      uVar19 = uVar4 * height;
      lVar11 = uVar12 + y * uVar4;
      local_98 = local_78 + (ulong)(uVar4 * uVar3) + lVar11;
      local_78 = local_78 + (lVar11 - (ulong)(uVar4 * uVar3));
      do {
        uVar13 = 0;
        if (uVar4 != uVar19) {
          bVar10 = *local_90;
          lVar11 = 0;
          uVar13 = 0;
          pbVar14 = local_90;
          puVar22 = local_98;
          puVar20 = local_78;
          do {
            if (pbVar14[uVar16] != bVar10) {
              uVar5 = ((int)lVar11 + uVar4) / uVar4;
              pbVar9 = puVar20 + uVar16;
              if (uVar5 < uVar3) {
                pbVar9 = local_90;
              }
              *(byte **)((long)pvVar8 + (ulong)uVar13 * 8) = pbVar9;
              pbVar9 = puVar22 + uVar16;
              if (height - uVar5 < uVar3) {
                pbVar9 = local_90 + uVar19;
              }
              *(byte **)((long)pvVar8 + (ulong)uVar13 * 8 + (ulong)height * 8) = pbVar9;
              bVar10 = ~bVar10;
              uVar13 = uVar13 + 1;
            }
            lVar11 = lVar11 + uVar16;
            pbVar14 = pbVar14 + uVar16;
            puVar22 = puVar22 + uVar16;
            puVar20 = puVar20 + uVar16;
          } while ((uVar16 - uVar19) + lVar11 != 0);
        }
        if (uVar13 != 0) {
          uVar12 = 0;
          do {
            puVar2 = *(uint8_t **)((long)pvVar8 + uVar12 * 8 + (ulong)height * 8);
            for (puVar18 = *(uint8_t **)((long)pvVar8 + uVar12 * 8); puVar18 != puVar2;
                puVar18 = puVar18 + uVar16) {
              *puVar18 = value;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar13);
        }
        local_90 = local_90 + 1;
        local_98 = local_98 + 1;
        local_78 = local_78 + 1;
      } while (local_90 != pbVar1);
    }
    operator_delete__(pvVar8);
    return;
  }
  return;
}

Assistant:

void Dilate( PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, uint32_t dilationX, uint32_t dilationY, uint8_t value )
    {
        Image_Function::ParameterValidation( image, x, y, width, height );
        Image_Function::VerifyGrayScaleImage( image );


        if( dilationX > width / 2 )
            dilationX = width / 2;
        if( dilationY > height / 2 )
            dilationY = height / 2;

        if( dilationX > 0u ) {
            const int32_t dilateX = static_cast<int32_t>(dilationX);

            uint8_t ** startPos = new uint8_t *[2 * width];
            uint8_t ** endPos = startPos + width;

            const uint32_t rowSize = image.rowSize();
            uint8_t * imageY    = image.data() + y * rowSize + x;
            uint8_t * imageYEnd = imageY + height * rowSize;

            for( ; imageY != imageYEnd; imageY += rowSize ) {
                uint32_t pairCount = 0u;

                uint8_t previousValue = *imageY;

                uint8_t * imageXStart = imageY;
                uint8_t * imageX      = imageXStart + 1;
                uint8_t * imageXEnd   = imageXStart + width;

                for( ; imageX != imageXEnd; ++imageX ) {
                    if( (*imageX) != previousValue ) {
                        if( imageX - imageXStart < dilateX )
                            startPos[pairCount] = imageXStart;
                        else
                            startPos[pairCount] = imageX - dilateX;

                        if( imageXEnd - imageX < dilateX )
                            endPos[pairCount] = imageXEnd;
                        else
                            endPos[pairCount] = imageX + dilateX;

                        previousValue = 0xFFu ^ previousValue;
                        ++pairCount;
                    }
                }

                for( uint32_t i = 0u; i < pairCount; ++i ) {
                    imageX    = startPos[i];
                    imageXEnd = endPos[i];

                    for( ; imageX != imageXEnd; ++imageX )
                        (*imageX) = value;
                }
            }

            delete[] startPos;
        }

        if( dilationY > 0u ) {
            uint8_t ** startPos = new uint8_t *[2 * height];
            uint8_t ** endPos = startPos + height;

            const uint32_t rowSize = image.rowSize();
            uint8_t * imageX    = image.data() + y * rowSize + x;
            uint8_t * imageXEnd = imageX + width;

            for( ; imageX != imageXEnd; ++imageX ) {
                uint32_t pairCount = 0u;

                uint8_t previousValue = *imageX;

                uint8_t * imageYStart = imageX;
                uint8_t * imageY      = imageYStart + rowSize;
                uint8_t * imageYEnd   = imageYStart + height * rowSize;

                for( ; imageY != imageYEnd; imageY += rowSize ) {
                    if( (*imageY) != previousValue ) {
                        const uint32_t rowId = static_cast<uint32_t>(imageY - imageYStart) / rowSize;

                        if( rowId < dilationY )
                            startPos[pairCount] = imageYStart;
                        else
                            startPos[pairCount] = imageY - dilationY * rowSize;

                        if( height - rowId < dilationY )
                            endPos[pairCount] = imageYEnd;
                        else
                            endPos[pairCount] = imageY + dilationY * rowSize;

                        previousValue = 0xFFu ^ previousValue;
                        ++pairCount;
                    }
                }

                for( uint32_t i = 0u; i < pairCount; ++i ) {
                    imageY    = startPos[i];
                    imageYEnd = endPos[i];

                    for( ; imageY != imageYEnd; imageY += rowSize )
                        (*imageY) = value;
                }
            }

            delete[] startPos;
        }
    }